

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

string * __thiscall
testing::internal::
DefaultParamName<std::tuple<int,bool(*)(unsigned_char_const*,int,int,int,double*,double*),double(*)(unsigned_char_const*,int,int,int,double,double,unsigned_char_const*,int,int,int,double,double)>>
          (string *__return_storage_ptr__,internal *this,
          TestParamInfo<std::tuple<int,_bool_(*)(const_unsigned_char_*,_int,_int,_int,_double_*,_double_*),_double_(*)(const_unsigned_char_*,_int,_int,_int,_double,_double,_const_unsigned_char_*,_int,_int,_int,_double,_double)>_>
          *info)

{
  Message name_stream;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_20;
  
  Message::Message((Message *)&local_20);
  std::ostream::_M_insert<unsigned_long>((ulong)(local_20._M_head_impl + 0x10));
  Message::GetString_abi_cxx11_(__return_storage_ptr__,(Message *)&local_20);
  if (local_20._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_20._M_head_impl + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultParamName(const TestParamInfo<ParamType>& info) {
  Message name_stream;
  name_stream << info.index;
  return name_stream.GetString();
}